

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctfst.c
# Opt level: O0

void jpeg_idct_ifast(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE JVar1;
  JSAMPLE *pJVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  JSAMPROW pJVar13;
  JSAMPLE aJStack_1a8 [3];
  JSAMPLE dcval_1;
  int dcval;
  int workspace [64];
  int local_9c;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  IFAST_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  DCTELEM z13;
  DCTELEM z12;
  DCTELEM z11;
  DCTELEM z10;
  DCTELEM z5;
  DCTELEM tmp13;
  DCTELEM tmp12;
  DCTELEM tmp11;
  DCTELEM tmp10;
  DCTELEM tmp7;
  DCTELEM tmp6;
  DCTELEM tmp5;
  DCTELEM tmp4;
  DCTELEM tmp3;
  DCTELEM tmp2;
  DCTELEM tmp1;
  DCTELEM tmp0;
  JDIMENSION output_col_local;
  JSAMPARRAY output_buf_local;
  JCOEFPTR coef_block_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  pJVar2 = cinfo->sample_range_limit;
  wsptr = (int *)compptr->dct_table;
  outptr = aJStack_1a8;
  quantptr = (IFAST_MULT_TYPE *)coef_block;
  for (local_9c = 8; 0 < local_9c; local_9c = local_9c + -1) {
    if (((((short)quantptr[4] == 0) && ((short)quantptr[8] == 0)) &&
        (((short)quantptr[0xc] == 0 &&
         ((((short)quantptr[0x10] == 0 && ((short)quantptr[0x14] == 0)) &&
          ((short)quantptr[0x18] == 0)))))) && ((short)quantptr[0x1c] == 0)) {
      iVar3 = (int)(short)*quantptr * *wsptr;
      *(int *)outptr = iVar3;
      *(int *)(outptr + 0x20) = iVar3;
      *(int *)(outptr + 0x40) = iVar3;
      *(int *)(outptr + 0x60) = iVar3;
      *(int *)(outptr + 0x80) = iVar3;
      *(int *)(outptr + 0xa0) = iVar3;
      *(int *)(outptr + 0xc0) = iVar3;
      *(int *)(outptr + 0xe0) = iVar3;
    }
    else {
      iVar4 = (int)(short)*quantptr * *wsptr;
      iVar3 = (int)(short)quantptr[8] * wsptr[0x10];
      iVar5 = (int)(short)quantptr[0x10] * wsptr[0x20];
      iVar6 = (int)(short)quantptr[0x18] * wsptr[0x30];
      iVar7 = iVar4 + iVar5;
      iVar4 = iVar4 - iVar5;
      iVar5 = iVar3 + iVar6;
      iVar3 = (int)((ulong)((long)(iVar3 - iVar6) * 0x16a) >> 8) - iVar5;
      iVar6 = iVar7 + iVar5;
      iVar7 = iVar7 - iVar5;
      iVar5 = iVar4 + iVar3;
      iVar4 = iVar4 - iVar3;
      iVar8 = (int)(short)quantptr[4] * wsptr[8];
      iVar3 = (int)(short)quantptr[0xc] * wsptr[0x18];
      iVar9 = (int)(short)quantptr[0x14] * wsptr[0x28];
      iVar10 = (int)(short)quantptr[0x1c] * wsptr[0x38];
      iVar11 = iVar9 + iVar3;
      iVar9 = iVar9 - iVar3;
      iVar3 = iVar8 + iVar10;
      iVar8 = iVar8 - iVar10;
      iVar10 = iVar3 + iVar11;
      iVar12 = (int)((ulong)((long)(iVar9 + iVar8) * 0x1d9) >> 8);
      iVar9 = ((int)((ulong)((long)iVar9 * -0x29d) >> 8) + iVar12) - iVar10;
      iVar3 = (int)((ulong)((long)(iVar3 - iVar11) * 0x16a) >> 8) - iVar9;
      iVar11 = ((int)((ulong)((long)iVar8 * 0x115) >> 8) - iVar12) + iVar3;
      *(int *)outptr = iVar6 + iVar10;
      *(int *)(outptr + 0xe0) = iVar6 - iVar10;
      *(int *)(outptr + 0x20) = iVar5 + iVar9;
      *(int *)(outptr + 0xc0) = iVar5 - iVar9;
      *(int *)(outptr + 0x40) = iVar4 + iVar3;
      *(int *)(outptr + 0xa0) = iVar4 - iVar3;
      *(int *)(outptr + 0x80) = iVar7 + iVar11;
      *(int *)(outptr + 0x60) = iVar7 - iVar11;
    }
    quantptr = (IFAST_MULT_TYPE *)((long)quantptr + 2);
    wsptr = wsptr + 1;
    outptr = outptr + 4;
  }
  outptr = aJStack_1a8;
  for (local_9c = 0; local_9c < 8; local_9c = local_9c + 1) {
    pJVar13 = output_buf[local_9c] + output_col;
    if ((((*(int *)(outptr + 4) == 0) && (*(int *)(outptr + 8) == 0)) &&
        (*(int *)(outptr + 0xc) == 0)) &&
       (((*(int *)(outptr + 0x10) == 0 && (*(int *)(outptr + 0x14) == 0)) &&
        ((*(int *)(outptr + 0x18) == 0 && (*(int *)(outptr + 0x1c) == 0)))))) {
      JVar1 = pJVar2[(long)(int)(*(int *)outptr >> 5 & 0x3ff) + 0x80];
      *pJVar13 = JVar1;
      pJVar13[1] = JVar1;
      pJVar13[2] = JVar1;
      pJVar13[3] = JVar1;
      pJVar13[4] = JVar1;
      pJVar13[5] = JVar1;
      pJVar13[6] = JVar1;
      pJVar13[7] = JVar1;
    }
    else {
      iVar5 = *(int *)(outptr + 8) + *(int *)(outptr + 0x18);
      iVar7 = (int)((ulong)((long)(*(int *)(outptr + 8) - *(int *)(outptr + 0x18)) * 0x16a) >> 8) -
              iVar5;
      iVar3 = *(int *)outptr + *(int *)(outptr + 0x10) + iVar5;
      iVar5 = (*(int *)outptr + *(int *)(outptr + 0x10)) - iVar5;
      iVar6 = (*(int *)outptr - *(int *)(outptr + 0x10)) + iVar7;
      iVar7 = (*(int *)outptr - *(int *)(outptr + 0x10)) - iVar7;
      iVar4 = *(int *)(outptr + 4) + *(int *)(outptr + 0x1c) +
              *(int *)(outptr + 0x14) + *(int *)(outptr + 0xc);
      iVar10 = (int)((ulong)((long)((*(int *)(outptr + 0x14) - *(int *)(outptr + 0xc)) +
                                   (*(int *)(outptr + 4) - *(int *)(outptr + 0x1c))) * 0x1d9) >> 8);
      iVar11 = ((int)((ulong)((long)(*(int *)(outptr + 0x14) - *(int *)(outptr + 0xc)) * -0x29d) >>
                     8) + iVar10) - iVar4;
      iVar9 = (int)((ulong)((long)((*(int *)(outptr + 4) + *(int *)(outptr + 0x1c)) -
                                  (*(int *)(outptr + 0x14) + *(int *)(outptr + 0xc))) * 0x16a) >> 8)
              - iVar11;
      iVar10 = ((int)((ulong)((long)(*(int *)(outptr + 4) - *(int *)(outptr + 0x1c)) * 0x115) >> 8)
               - iVar10) + iVar9;
      *pJVar13 = pJVar2[(long)(int)(iVar3 + iVar4 >> 5 & 0x3ff) + 0x80];
      pJVar13[7] = pJVar2[(long)(int)(iVar3 - iVar4 >> 5 & 0x3ff) + 0x80];
      pJVar13[1] = pJVar2[(long)(int)(iVar6 + iVar11 >> 5 & 0x3ff) + 0x80];
      pJVar13[6] = pJVar2[(long)(int)(iVar6 - iVar11 >> 5 & 0x3ff) + 0x80];
      pJVar13[2] = pJVar2[(long)(int)(iVar7 + iVar9 >> 5 & 0x3ff) + 0x80];
      pJVar13[5] = pJVar2[(long)(int)(iVar7 - iVar9 >> 5 & 0x3ff) + 0x80];
      pJVar13[4] = pJVar2[(long)(int)(iVar5 + iVar10 >> 5 & 0x3ff) + 0x80];
      pJVar13[3] = pJVar2[(long)(int)(iVar5 - iVar10 >> 5 & 0x3ff) + 0x80];
    }
    outptr = outptr + 0x20;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_ifast (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		 JCOEFPTR coef_block,
		 JSAMPARRAY output_buf, JDIMENSION output_col)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z5, z10, z11, z12, z13;
  JCOEFPTR inptr;
  IFAST_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];	/* buffers data between passes */
  SHIFT_TEMPS			/* for DESCALE */
  ISHIFT_TEMPS			/* for IDESCALE */

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (IFAST_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */
    
    if (inptr[DCTSIZE*1] == 0 && inptr[DCTSIZE*2] == 0 &&
	inptr[DCTSIZE*3] == 0 && inptr[DCTSIZE*4] == 0 &&
	inptr[DCTSIZE*5] == 0 && inptr[DCTSIZE*6] == 0 &&
	inptr[DCTSIZE*7] == 0) {
      /* AC terms all zero */
      int dcval = (int) DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);

      wsptr[DCTSIZE*0] = dcval;
      wsptr[DCTSIZE*1] = dcval;
      wsptr[DCTSIZE*2] = dcval;
      wsptr[DCTSIZE*3] = dcval;
      wsptr[DCTSIZE*4] = dcval;
      wsptr[DCTSIZE*5] = dcval;
      wsptr[DCTSIZE*6] = dcval;
      wsptr[DCTSIZE*7] = dcval;
      
      inptr++;			/* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }
    
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);

    tmp10 = tmp0 + tmp2;	/* phase 3 */
    tmp11 = tmp0 - tmp2;

    tmp13 = tmp1 + tmp3;	/* phases 5-3 */
    tmp12 = MULTIPLY(tmp1 - tmp3, FIX_1_414213562) - tmp13; /* 2*c4 */

    tmp0 = tmp10 + tmp13;	/* phase 2 */
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;
    
    /* Odd part */

    tmp4 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    tmp5 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    tmp6 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp7 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);

    z13 = tmp6 + tmp5;		/* phase 6 */
    z10 = tmp6 - tmp5;
    z11 = tmp4 + tmp7;
    z12 = tmp4 - tmp7;

    tmp7 = z11 + z13;		/* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, - FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;	/* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    wsptr[DCTSIZE*0] = (int) (tmp0 + tmp7);
    wsptr[DCTSIZE*7] = (int) (tmp0 - tmp7);
    wsptr[DCTSIZE*1] = (int) (tmp1 + tmp6);
    wsptr[DCTSIZE*6] = (int) (tmp1 - tmp6);
    wsptr[DCTSIZE*2] = (int) (tmp2 + tmp5);
    wsptr[DCTSIZE*5] = (int) (tmp2 - tmp5);
    wsptr[DCTSIZE*4] = (int) (tmp3 + tmp4);
    wsptr[DCTSIZE*3] = (int) (tmp3 - tmp4);

    inptr++;			/* advance pointers to next column */
    quantptr++;
    wsptr++;
  }
  
  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */
    
#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
	wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[IDESCALE(wsptr[0], PASS1_BITS+3)
				  & RANGE_MASK];
      
      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;		/* advance pointer to next row */
      continue;
    }
#endif
    
    /* Even part */

    tmp10 = ((DCTELEM) wsptr[0] + (DCTELEM) wsptr[4]);
    tmp11 = ((DCTELEM) wsptr[0] - (DCTELEM) wsptr[4]);

    tmp13 = ((DCTELEM) wsptr[2] + (DCTELEM) wsptr[6]);
    tmp12 = MULTIPLY((DCTELEM) wsptr[2] - (DCTELEM) wsptr[6], FIX_1_414213562)
	    - tmp13;

    tmp0 = tmp10 + tmp13;
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    z13 = (DCTELEM) wsptr[5] + (DCTELEM) wsptr[3];
    z10 = (DCTELEM) wsptr[5] - (DCTELEM) wsptr[3];
    z11 = (DCTELEM) wsptr[1] + (DCTELEM) wsptr[7];
    z12 = (DCTELEM) wsptr[1] - (DCTELEM) wsptr[7];

    tmp7 = z11 + z13;		/* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, - FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;	/* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    /* Final output stage: scale down by a factor of 8 and range-limit */

    outptr[0] = range_limit[IDESCALE(tmp0 + tmp7, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[7] = range_limit[IDESCALE(tmp0 - tmp7, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[IDESCALE(tmp1 + tmp6, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[6] = range_limit[IDESCALE(tmp1 - tmp6, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[IDESCALE(tmp2 + tmp5, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[5] = range_limit[IDESCALE(tmp2 - tmp5, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[4] = range_limit[IDESCALE(tmp3 + tmp4, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[IDESCALE(tmp3 - tmp4, PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += DCTSIZE;		/* advance pointer to next row */
  }
}